

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server.cpp
# Opt level: O2

variant<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
* __thiscall
lscpp::my_lsp_server::completion
          (variant<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
           *__return_storage_ptr__,my_lsp_server *this,CompletionParams *params)

{
  Verbosity VVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  initializer_list<lscpp::protocol::CompletionItem> __l;
  allocator_type local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_> local_38
  ;
  
  VVar1 = loguru::current_verbosity_cutoff();
  if (-1 < VVar1) {
    loguru::log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  this->counter = this->counter + 1;
  std::operator+(&local_58,"bla",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_58;
  std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>::
  vector(&local_38,__l,&local_59);
  *(pointer *)
   &(__return_storage_ptr__->
    super__Variant_base<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
    ).super__Move_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>.
    super__Copy_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>.
    super__Move_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
    super__Copy_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
    super__Variant_storage_alias<std::vector<lscpp::protocol::CompletionItem>_>._M_u =
       local_38.
       super__Vector_base<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Variant_base<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
           ).super__Move_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>.
           super__Copy_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>.
           super__Move_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
           super__Copy_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
           super__Variant_storage_alias<std::vector<lscpp::protocol::CompletionItem>_>._M_u + 8) =
       local_38.
       super__Vector_base<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Variant_base<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
           ).super__Move_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>.
           super__Copy_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>.
           super__Move_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
           super__Copy_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
           super__Variant_storage_alias<std::vector<lscpp::protocol::CompletionItem>_>._M_u + 0x10)
       = local_38.
         super__Vector_base<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.
  super__Vector_base<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Variant_base<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
  ).super__Move_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>.
  super__Copy_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>.
  super__Move_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
  super__Copy_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
  super__Variant_storage_alias<std::vector<lscpp::protocol::CompletionItem>_>._M_index = '\0';
  std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>::
  ~vector(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::variant<std::vector<protocol::CompletionItem>>
  completion(protocol::CompletionParams params) override {
    LOG_F(INFO, "In sample_server2: completion");
    counter++;
    return std::vector<protocol::CompletionItem>{
        {"bla" + params.textDocument.uri}};
  }